

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void in_memory_snapshot_compaction_test(void)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  fdb_doc *doc_00;
  fdb_status fVar4;
  int iVar5;
  fdb_kvs_handle *pfVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  fdb_kvs_handle *doc_01;
  fdb_iterator *doc_02;
  fdb_kvs_handle *pfVar10;
  fdb_kvs_handle *in_RCX;
  fdb_kvs_handle *extraout_RDX;
  fdb_kvs_handle *pfVar11;
  fdb_kvs_handle *doc_03;
  uint uVar12;
  ulong unaff_RBP;
  __atomic_base<unsigned_long> _Var13;
  char *pcVar14;
  fdb_iterator *pfVar15;
  fdb_kvs_handle *unaff_R12;
  fdb_kvs_handle *unaff_R13;
  long lVar16;
  __atomic_base<unsigned_long> handle;
  ulong uVar17;
  fdb_file_handle *unaff_R15;
  fdb_doc **doc_04;
  fdb_iterator *config;
  char keystr [6];
  fdb_file_handle *db_file;
  fdb_doc *doc;
  fdb_kvs_handle *snap;
  fdb_iterator *fit;
  char valuestr [10];
  fdb_kvs_handle *db;
  fdb_kvs_handle *db2;
  size_t valuelen;
  void *value_out;
  cb_inmem_snap_args cargs;
  fdb_kvs_info info;
  timeval __test_begin;
  char key [256];
  char cmd [256];
  fdb_doc *pfStack_ca8;
  fdb_iterator *pfStack_ca0;
  int iStack_c94;
  fdb_kvs_handle *pfStack_c90;
  timeval tStack_c88;
  fdb_kvs_handle *pfStack_c78;
  fdb_kvs_handle *pfStack_c70;
  fdb_kvs_handle *pfStack_c68;
  fdb_kvs_handle *pfStack_c60;
  fdb_iterator *pfStack_c58;
  fdb_iterator *pfStack_c50;
  fdb_kvs_handle *pfStack_c40;
  fdb_kvs_handle *pfStack_c38;
  undefined1 auStack_c30 [24];
  fdb_kvs_handle *pfStack_c18;
  fdb_kvs_handle *pfStack_c10;
  fdb_kvs_handle *pfStack_c08;
  fdb_kvs_handle *pfStack_c00;
  undefined1 auStack_bf8 [80];
  undefined8 auStack_ba8 [5];
  fdb_doc *apfStack_b80 [6];
  fdb_kvs_info fStack_b50;
  timeval tStack_b20;
  undefined1 auStack_b10 [280];
  fdb_iterator fStack_9f8;
  fdb_kvs_handle fStack_8f8;
  fdb_kvs_handle *pfStack_6f0;
  fdb_kvs_handle *pfStack_6e8;
  fdb_kvs_handle *pfStack_6e0;
  code *pcStack_6d8;
  fdb_kvs_handle *pfStack_6c8;
  fdb_iterator *pfStack_6c0;
  fdb_kvs_handle *pfStack_6b8;
  fdb_kvs_handle *pfStack_6b0;
  fdb_custom_cmp_variable *pp_Stack_6a8;
  size_t sStack_6a0;
  fdb_kvs_handle *pfStack_698;
  fdb_kvs_info fStack_690;
  undefined1 auStack_660 [10];
  undefined1 auStack_656 [14];
  undefined2 uStack_648;
  fdb_encryption_key afStack_550 [7];
  fdb_kvs_handle *pfStack_448;
  fdb_kvs_handle *pfStack_440;
  fdb_kvs_handle *pfStack_438;
  fdb_kvs_handle *pfStack_430;
  fdb_file_handle *pfStack_428;
  code *pcStack_420;
  undefined1 local_410 [48];
  undefined2 local_3e0;
  fdb_kvs_handle *local_3d8;
  __atomic_base<unsigned_long> local_3d0;
  void *local_3c8;
  atomic<unsigned_long> local_3c0;
  undefined1 local_3b8 [64];
  undefined1 local_378 [8];
  docio_handle *local_370;
  timeval local_348;
  undefined1 local_338 [280];
  fdb_log_callback_ex local_220;
  uint8_t local_218;
  undefined2 local_210;
  atomic<unsigned_char> local_1f0;
  code *local_1d8;
  undefined4 local_1d0;
  fdb_txn *local_1c8;
  fdb_kvs_handle *local_138;
  char acStack_130 [256];
  
  pcStack_420 = (code *)0x113077;
  gettimeofday(&local_348,(__timezone_ptr_t)0x0);
  local_410._4_2_ = 100;
  local_410._0_4_ = 0x3530256b;
  local_3e0 = 100;
  local_410._40_8_ = (fdb_log_callback)0x38302565756c6176;
  builtin_strncpy(acStack_130,"mvcc_test* > errorlog.txt",0x1a);
  local_138 = (fdb_kvs_handle *)0x202066722d206d72;
  pcStack_420 = (code *)0x1130c4;
  system((char *)&local_138);
  pcStack_420 = (code *)0x1130c9;
  memleak_start();
  pcStack_420 = (code *)0x1130d3;
  pfVar6 = (fdb_kvs_handle *)malloc(0x20);
  pfVar11 = (fdb_kvs_handle *)(local_338 + 0x108);
  pcStack_420 = (code *)0x1130e6;
  fdb_get_default_config();
  local_210 = 0x201;
  local_218 = '\x01';
  local_220 = (fdb_log_callback_ex)0x2;
  local_1f0.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)'\x01';
  local_338._272_8_ = (fdb_log_callback)0x0;
  local_1d8 = cb_inmem_snap;
  local_1d0 = 2;
  local_1c8 = (fdb_txn *)local_3b8;
  pcStack_420 = (code *)0x113130;
  fdb_get_default_kvs_config();
  pcStack_420 = (code *)0x113144;
  fVar4 = fdb_open((fdb_file_handle **)(local_410 + 8),"./mvcc_test",(fdb_config *)pfVar11);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113544;
  in_RCX = (fdb_kvs_handle *)((long)local_3b8 + 0x28);
  pcStack_420 = (code *)0x11316a;
  fVar4 = fdb_kvs_open((fdb_file_handle *)local_410._8_8_,&local_3d8,"db",(fdb_kvs_config *)in_RCX);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113549;
  in_RCX = (fdb_kvs_handle *)((long)local_3b8 + 0x28);
  pcStack_420 = (code *)0x113190;
  fVar4 = fdb_kvs_open((fdb_file_handle *)local_410._8_8_,(fdb_kvs_handle **)&local_3d0,"db",
                       (fdb_kvs_config *)in_RCX);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011354e;
  local_3b8._0_8_ = local_3d0._M_i;
  local_3b8._8_8_ = (void *)0xa;
  local_3b8._24_8_ = local_410;
  unaff_R15 = (fdb_file_handle *)(local_410 + 0x28);
  local_3b8._16_4_ = 0x20;
  pfVar11 = (fdb_kvs_handle *)((long)&pfVar6->kvs + 2);
  unaff_R12 = (fdb_kvs_handle *)local_338;
  unaff_RBP = 0;
  local_3b8._32_8_ = unaff_R15;
  do {
    pcStack_420 = (code *)0x1131ec;
    sprintf((char *)unaff_R12,local_410,unaff_RBP);
    *(undefined4 *)&pfVar6->kvs_config = 0x78787878;
    *(uint32_t *)&(pfVar6->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar6->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar6->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)&(pfVar6->kvs_config).custom_cmp_param = 0x78787878;
    *(undefined4 *)((long)&(pfVar6->kvs_config).custom_cmp_param + 4) = 0x78787878;
    *(undefined4 *)&pfVar6->kvs = 0x78787878;
    *(uint32_t *)((long)&pfVar6->kvs + 4) = 0x78787878;
    *(undefined2 *)((long)&pfVar6->kvs + 6) = 0x3e;
    *(undefined4 *)&pfVar11->kvs_config = 0x646e653c;
    pcStack_420 = (code *)0x113217;
    sprintf((char *)pfVar6,(char *)unaff_R15,unaff_RBP);
    unaff_R13 = local_3d8;
    pcStack_420 = (code *)0x113224;
    sVar7 = strlen((char *)unaff_R12);
    pcStack_420 = (code *)0x11323c;
    in_RCX = pfVar6;
    fVar4 = fdb_set_kv(unaff_R13,unaff_R12,sVar7 + 1,pfVar6,0x20);
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcStack_420 = (code *)0x11350e;
      in_memory_snapshot_compaction_test();
      goto LAB_0011350e;
    }
    uVar12 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar12;
  } while (uVar12 != 10);
  pcStack_420 = (code *)0x11325a;
  fVar4 = fdb_commit((fdb_file_handle *)local_410._8_8_,'\x01');
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113553;
  pcStack_420 = (code *)0x113273;
  fVar4 = fdb_compact((fdb_file_handle *)local_410._8_8_,"./mvcc_test2");
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113558;
  pcStack_420 = (code *)0x113291;
  fVar4 = fdb_snapshot_open(local_3d8,(fdb_kvs_handle **)(local_410 + 0x18),0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011355d;
  pcStack_420 = (code *)0x1132ab;
  fVar4 = fdb_get_kvs_info((fdb_kvs_handle *)local_410._24_8_,(fdb_kvs_info *)local_378);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113562;
  if (local_370 != (docio_handle *)0xb) {
    pcStack_420 = (code *)0x1132cb;
    in_memory_snapshot_compaction_test();
  }
  in_RCX = (fdb_kvs_handle *)0x0;
  pcStack_420 = (code *)0x1132eb;
  fVar4 = fdb_iterator_init((fdb_kvs_handle *)local_410._24_8_,(fdb_iterator **)(local_410 + 0x20),
                            (void *)0x0,0,(void *)0x0,0,0);
  doc_01 = unaff_R13;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113567;
  unaff_R15 = (fdb_file_handle *)local_338;
  unaff_RBP = 0;
  do {
    local_410._16_8_ = (fdb_kvs_handle *)0x0;
    pcStack_420 = (code *)0x113315;
    fVar4 = fdb_iterator_get((fdb_iterator *)local_410._32_8_,(fdb_doc **)(local_410 + 0x10));
    unaff_R13 = (fdb_kvs_handle *)local_410._16_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) break;
    if ((uint)unaff_RBP < 10) {
      pcStack_420 = (code *)0x113333;
      sprintf((char *)unaff_R15,local_410,unaff_RBP);
      *(undefined4 *)&pfVar6->kvs_config = 0x78787878;
      *(uint32_t *)&(pfVar6->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar6->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar6->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar6->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar6->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar6->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar6->kvs + 4) = 0x78787878;
      *(undefined2 *)((long)&pfVar6->kvs + 6) = 0x3e;
      *(undefined4 *)&pfVar11->kvs_config = 0x646e653c;
      pcStack_420 = (code *)0x113360;
      sprintf((char *)pfVar6,local_410 + 0x28,unaff_RBP);
      unaff_R13 = (fdb_kvs_handle *)local_410._16_8_;
      unaff_R12 = *(fdb_kvs_handle **)(local_410._16_8_ + 0x20);
      pcStack_420 = (code *)0x113378;
      iVar5 = bcmp(unaff_R12,unaff_R15,*(size_t *)(fdb_kvs_config *)local_410._16_8_);
      if (iVar5 != 0) goto LAB_00113529;
      unaff_R12 = (fdb_kvs_handle *)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)unaff_R13 + 0x40))->
                  seqtree;
      pcStack_420 = (code *)0x113393;
      iVar5 = bcmp(unaff_R12,pfVar6,(size_t)(unaff_R13->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_00113539;
    }
    else {
      local_338._0_8_ = (btreeblk_handle *)0x79656b5f77656e;
      *(void **)&pfVar6->kvs_config = (void *)0x756c61765f77656e;
      *(undefined2 *)&(pfVar6->kvs_config).custom_cmp = 0x65;
      unaff_R12 = *(fdb_kvs_handle **)(local_410._16_8_ + 0x20);
      pcStack_420 = (code *)0x1133d9;
      iVar5 = bcmp(unaff_R12,unaff_R15,*(size_t *)(fdb_kvs_config *)local_410._16_8_);
      if (iVar5 != 0) goto LAB_0011350e;
      unaff_R12 = (fdb_kvs_handle *)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)unaff_R13 + 0x40))->
                  seqtree;
      pcStack_420 = (code *)0x1133f4;
      iVar5 = bcmp(unaff_R12,pfVar6,(size_t)(unaff_R13->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0011351e;
    }
    unaff_RBP = (ulong)((uint)unaff_RBP + 1);
    pcStack_420 = (code *)0x113408;
    fdb_doc_free((fdb_doc *)local_410._16_8_);
    pcStack_420 = (code *)0x113412;
    fVar4 = fdb_iterator_next((fdb_iterator *)local_410._32_8_);
    doc_01 = unaff_R13;
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if ((int)unaff_RBP != 0xb) goto LAB_0011356c;
  pcStack_420 = (code *)0x11342d;
  fVar4 = fdb_iterator_close((fdb_iterator *)local_410._32_8_);
  handle._M_i = local_410._24_8_;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113571;
  unaff_R15 = (fdb_file_handle *)local_338;
  pcStack_420 = (code *)0x11344a;
  sVar7 = strlen((char *)unaff_R15);
  in_RCX = (fdb_kvs_handle *)&local_3c0;
  pcStack_420 = (code *)0x113463;
  fVar4 = fdb_get_kv((fdb_kvs_handle *)handle._M_i,unaff_R15,sVar7 + 1,(void **)in_RCX,
                     (size_t *)&local_3c8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113576;
  pcStack_420 = (code *)0x113480;
  _Var13._M_i = (__int_type)pfVar6;
  iVar5 = bcmp((void *)local_3c0.super___atomic_base<unsigned_long>._M_i,pfVar6,(size_t)local_3c8);
  handle = local_3c0.super___atomic_base<unsigned_long>._M_i;
  if (iVar5 != 0) goto LAB_0011357b;
  pcStack_420 = (code *)0x113490;
  fdb_free_block((void *)local_3c0.super___atomic_base<unsigned_long>._M_i);
  pcStack_420 = (code *)0x11349a;
  fdb_kvs_close((fdb_kvs_handle *)local_410._24_8_);
  pcStack_420 = (code *)0x1134a4;
  fVar4 = fdb_close((fdb_file_handle *)local_410._8_8_);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113586;
  pcStack_420 = (code *)0x1134b1;
  fVar4 = fdb_shutdown();
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pcStack_420 = (code *)0x1134c1;
    free(pfVar6);
    pcStack_420 = (code *)0x1134c6;
    memleak_end();
    pcVar14 = "%s PASSED\n";
    if (in_memory_snapshot_compaction_test()::__test_pass != '\0') {
      pcVar14 = "%s FAILED\n";
    }
    pcStack_420 = (code *)0x1134f7;
    fprintf(_stderr,pcVar14,"in-memory snapshot with concurrent compaction test");
    return;
  }
  goto LAB_0011358b;
LAB_00113a98:
  pcStack_6d8 = (code *)0x113aa8;
  cb_inmem_snap();
LAB_00113aa8:
  pcStack_6d8 = (code *)0x113ab8;
  cb_inmem_snap();
LAB_00113ab8:
  pcStack_6d8 = (code *)0x113ac8;
  cb_inmem_snap();
LAB_00113ac8:
  pfVar11 = (fdb_kvs_handle *)afStack_550;
  unaff_R12 = (fdb_kvs_handle *)(auStack_656 + 6);
  pcStack_6d8 = (code *)0x113ad8;
  cb_inmem_snap();
  goto LAB_00113ad8;
LAB_0011456a:
  pfStack_c50 = (fdb_iterator *)0x114575;
  snapshot_clone_test();
  pfVar10 = pfVar6;
LAB_00114575:
  pfVar6 = pfVar10;
  pfStack_c50 = (fdb_iterator *)0x11457a;
  snapshot_clone_test();
LAB_0011457a:
  pfStack_c50 = (fdb_iterator *)0x114585;
  snapshot_clone_test();
LAB_00114585:
  pfVar11 = (fdb_kvs_handle *)&pfStack_c38;
  pfStack_c50 = (fdb_iterator *)0x114590;
  snapshot_clone_test();
  goto LAB_00114590;
LAB_0011350e:
  pcStack_420 = (code *)0x11351e;
  in_memory_snapshot_compaction_test();
LAB_0011351e:
  pcStack_420 = (code *)0x113529;
  in_memory_snapshot_compaction_test();
LAB_00113529:
  pcStack_420 = (code *)0x113539;
  in_memory_snapshot_compaction_test();
LAB_00113539:
  pcStack_420 = (code *)0x113544;
  in_memory_snapshot_compaction_test();
LAB_00113544:
  pcStack_420 = (code *)0x113549;
  in_memory_snapshot_compaction_test();
LAB_00113549:
  pcStack_420 = (code *)0x11354e;
  in_memory_snapshot_compaction_test();
LAB_0011354e:
  pcStack_420 = (code *)0x113553;
  in_memory_snapshot_compaction_test();
LAB_00113553:
  pcStack_420 = (code *)0x113558;
  in_memory_snapshot_compaction_test();
LAB_00113558:
  pcStack_420 = (code *)0x11355d;
  in_memory_snapshot_compaction_test();
LAB_0011355d:
  pcStack_420 = (code *)0x113562;
  in_memory_snapshot_compaction_test();
LAB_00113562:
  pcStack_420 = (code *)0x113567;
  in_memory_snapshot_compaction_test();
  doc_01 = unaff_R13;
LAB_00113567:
  pcStack_420 = (code *)0x11356c;
  in_memory_snapshot_compaction_test();
LAB_0011356c:
  pcStack_420 = (code *)0x113571;
  in_memory_snapshot_compaction_test();
LAB_00113571:
  handle._M_i = (__int_type)pfVar11;
  pcStack_420 = (code *)0x113576;
  in_memory_snapshot_compaction_test();
LAB_00113576:
  pcStack_420 = (code *)0x11357b;
  in_memory_snapshot_compaction_test();
LAB_0011357b:
  pcStack_420 = (code *)0x113586;
  _Var13._M_i = handle._M_i;
  in_memory_snapshot_compaction_test();
LAB_00113586:
  pcStack_420 = (code *)0x11358b;
  in_memory_snapshot_compaction_test();
LAB_0011358b:
  pcStack_420 = cb_inmem_snap;
  in_memory_snapshot_compaction_test();
  uVar17 = _Var13._M_i & 0xffffffff;
  pfVar11 = (fdb_kvs_handle *)0x0;
  pcStack_6d8 = (code *)0x1135b8;
  pfStack_448 = pfVar6;
  pfStack_440 = unaff_R12;
  pfStack_438 = doc_01;
  pfStack_430 = (fdb_kvs_handle *)handle._M_i;
  pfStack_428 = unaff_R15;
  pcStack_420 = (code *)unaff_RBP;
  gettimeofday((timeval *)auStack_660,(__timezone_ptr_t)0x0);
  if ((int)_Var13._M_i != 2) {
    return;
  }
  pfVar6 = extraout_RDX;
  if (extraout_RDX == (fdb_kvs_handle *)0x0) {
LAB_00113ad8:
    pcStack_6d8 = (code *)0x113add;
    cb_inmem_snap();
LAB_00113add:
    pcStack_6d8 = (code *)0x113ae2;
    cb_inmem_snap();
LAB_00113ae2:
    pcStack_6d8 = (code *)0x113ae7;
    cb_inmem_snap();
LAB_00113ae7:
    pcStack_6d8 = (code *)0x113aec;
    cb_inmem_snap();
LAB_00113aec:
    pcStack_6d8 = (code *)0x113af1;
    cb_inmem_snap();
LAB_00113af1:
    pcStack_6d8 = (code *)0x113af6;
    cb_inmem_snap();
LAB_00113af6:
    pcStack_6d8 = (code *)0x113afb;
    cb_inmem_snap();
    pfVar10 = pfVar6;
LAB_00113afb:
    pcStack_6d8 = (code *)0x113b00;
    cb_inmem_snap();
LAB_00113b00:
    pfVar6 = in_RCX;
    pcStack_6d8 = (code *)0x113b05;
    cb_inmem_snap();
LAB_00113b05:
    pcStack_6d8 = (code *)0x113b0a;
    cb_inmem_snap();
  }
  else {
    pfVar6 = (fdb_kvs_handle *)CONCAT26(local_410._6_2_,CONCAT24(local_410._4_2_,local_410._0_4_));
    pfVar11 = (fdb_kvs_handle *)(ulong)*(byte *)&in_RCX->file;
    iVar5 = *(int *)((long)&(pfVar6->kvs_config).custom_cmp + 4);
    *(int *)((long)&(pfVar6->kvs_config).custom_cmp + 4) = iVar5 + 1;
    if (iVar5 != 4) {
      if (iVar5 != 1) {
        return;
      }
      pcStack_6d8 = (code *)0x113607;
      fVar4 = fdb_snapshot_open(*(fdb_kvs_handle **)&pfVar6->kvs_config,&pfStack_6b8,
                                0xffffffffffffffff);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113add;
      pcStack_6d8 = (code *)0x11361e;
      fVar4 = fdb_get_kvs_info(pfStack_6b8,&fStack_690);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113ae7;
      in_RCX = (fdb_kvs_handle *)&(pfVar6->kvs_config).custom_cmp;
      if (fStack_690.last_seqnum != (long)*(int *)&(pfVar6->kvs_config).custom_cmp) {
        pcStack_6d8 = (code *)0x113a46;
        cb_inmem_snap();
      }
      pcStack_6d8 = (code *)0x113663;
      pfStack_6b0 = pfVar11;
      pp_Stack_6a8 = (fdb_custom_cmp_variable *)in_RCX;
      fVar4 = fdb_iterator_init(pfStack_6b8,&pfStack_6c0,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pfVar6 = (fdb_kvs_handle *)(auStack_660 + 10);
        pcVar14 = auStack_656 + 6;
        uVar17 = 0;
        do {
          pfStack_6c8 = (fdb_kvs_handle *)0x0;
          pcStack_6d8 = (code *)0x11369a;
          fVar4 = fdb_iterator_get(pfStack_6c0,(fdb_doc **)&pfStack_6c8);
          if (fVar4 != FDB_RESULT_SUCCESS) break;
          lVar16 = CONCAT26(local_410._6_2_,CONCAT24(local_410._4_2_,local_410._0_4_));
          pcStack_6d8 = (code *)0x1136ba;
          sprintf((char *)afStack_550,*(char **)(lVar16 + 0x18),uVar17);
          sVar7 = (size_t)*(int *)(lVar16 + 0x10);
          pcStack_6d8 = (code *)0x1136ce;
          memset(pcVar14,0x78,sVar7);
          *(undefined4 *)(&(pfVar6->kvs_config).create_if_missing + sVar7) = 0x646e653c;
          *(undefined2 *)(auStack_656 + sVar7 + 4) = 0x3e;
          pcStack_6d8 = (code *)0x1136ee;
          sprintf(pcVar14,*(char **)(lVar16 + 0x20),uVar17);
          doc_01 = pfStack_6c8;
          in_RCX = (fdb_kvs_handle *)pfStack_6c8->op_stats;
          pcStack_6d8 = (code *)0x113706;
          iVar5 = bcmp(in_RCX,afStack_550,*(size_t *)&pfStack_6c8->kvs_config);
          if (iVar5 != 0) {
            pcStack_6d8 = (code *)0x113a88;
            cb_inmem_snap();
LAB_00113a88:
            pcStack_6d8 = (code *)0x113a98;
            cb_inmem_snap();
            goto LAB_00113a98;
          }
          in_RCX = (fdb_kvs_handle *)(doc_01->field_6).seqtree;
          pcStack_6d8 = (code *)0x113721;
          iVar5 = bcmp(in_RCX,pcVar14,(size_t)(doc_01->kvs_config).custom_cmp_param);
          if (iVar5 != 0) goto LAB_00113a88;
          uVar17 = (ulong)((int)uVar17 + 1);
          pcStack_6d8 = (code *)0x113733;
          fdb_doc_free((fdb_doc *)doc_01);
          pcStack_6d8 = (code *)0x11373d;
          fVar4 = fdb_iterator_next(pfStack_6c0);
        } while (fVar4 == FDB_RESULT_SUCCESS);
        if ((int)uVar17 != *(int *)pp_Stack_6a8) {
          pcStack_6d8 = (code *)0x113a64;
          cb_inmem_snap();
        }
        pcStack_6d8 = (code *)0x11375c;
        fVar4 = fdb_iterator_close(pfStack_6c0);
        pfVar11 = pfStack_6b0;
        if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00113a19;
        pcStack_6d8 = (code *)0x11376e;
        cb_inmem_snap();
        goto LAB_0011376e;
      }
      goto LAB_00113af1;
    }
LAB_0011376e:
    pfStack_6b0 = pfVar11;
    in_RCX = (fdb_kvs_handle *)afStack_550;
    afStack_550[0].algorithm = 0x5f77656e;
    builtin_memcpy(&afStack_550[0].algorithm,"key",4);
    doc_01 = (fdb_kvs_handle *)(auStack_656 + 6);
    auStack_656._6_8_ = 0x756c61765f77656e;
    uStack_648 = 0x65;
    pfVar11 = *(fdb_kvs_handle **)&pfVar6->kvs_config;
    pcStack_6d8 = (code *)0x1137b0;
    sVar7 = strlen((char *)in_RCX);
    unaff_R12 = (fdb_kvs_handle *)(sVar7 + 1);
    pcStack_6d8 = (code *)0x1137bc;
    sVar7 = strlen((char *)doc_01);
    pcStack_6d8 = (code *)0x1137d1;
    fVar4 = fdb_set_kv(pfVar11,in_RCX,(size_t)unaff_R12,doc_01,sVar7 + 1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113ae2;
    pcStack_6d8 = (code *)0x1137ed;
    fVar4 = fdb_snapshot_open(*(fdb_kvs_handle **)&pfVar6->kvs_config,&pfStack_6b8,
                              0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113aec;
    pcStack_6d8 = (code *)0x113804;
    fVar4 = fdb_get_kvs_info(pfStack_6b8,&fStack_690);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113af6;
    in_RCX = (fdb_kvs_handle *)&(pfVar6->kvs_config).custom_cmp;
    if (fStack_690.last_seqnum != (long)*(int *)&(pfVar6->kvs_config).custom_cmp + 1U) {
      pcStack_6d8 = (code *)0x113a58;
      cb_inmem_snap();
    }
    pcStack_6d8 = (code *)0x113842;
    fVar4 = fdb_iterator_init(pfStack_6b8,&pfStack_6c0,(void *)0x0,0,(void *)0x0,0,0);
    pfVar10 = pfVar6;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113afb;
    unaff_R12 = (fdb_kvs_handle *)(auStack_656 + 6);
    uVar17 = 0;
    do {
      pfStack_6c8 = (fdb_kvs_handle *)0x0;
      pcStack_6d8 = (code *)0x113874;
      fVar4 = fdb_iterator_get(pfStack_6c0,(fdb_doc **)&pfStack_6c8);
      pfVar6 = pfStack_6c8;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      if ((int)uVar17 < *(int *)in_RCX) {
        lVar16 = CONCAT26(local_410._6_2_,CONCAT24(local_410._4_2_,local_410._0_4_));
        pcStack_6d8 = (code *)0x11389c;
        sprintf((char *)afStack_550,*(char **)(lVar16 + 0x18),uVar17);
        sVar7 = (size_t)*(int *)(lVar16 + 0x10);
        pcStack_6d8 = (code *)0x1138b0;
        memset(unaff_R12,0x78,sVar7);
        *(undefined4 *)(auStack_660 + sVar7 + 10) = 0x646e653c;
        *(undefined2 *)(auStack_656 + sVar7 + 4) = 0x3e;
        pcStack_6d8 = (code *)0x1138d5;
        sprintf((char *)unaff_R12,*(char **)(lVar16 + 0x20),uVar17);
        pfVar6 = pfStack_6c8;
        doc_01 = (fdb_kvs_handle *)pfStack_6c8->op_stats;
        pcStack_6d8 = (code *)0x1138ec;
        iVar5 = bcmp(doc_01,afStack_550,*(size_t *)&pfStack_6c8->kvs_config);
        if (iVar5 != 0) goto LAB_00113aa8;
        doc_01 = (fdb_kvs_handle *)(pfVar6->field_6).seqtree;
        pcStack_6d8 = (code *)0x113907;
        iVar5 = bcmp(doc_01,unaff_R12,(size_t)(pfVar6->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00113ab8;
      }
      else {
        afStack_550[0].algorithm = 0x5f77656e;
        builtin_memcpy(&afStack_550[0].algorithm,"key",4);
        auStack_656._6_8_ = 0x756c61765f77656e;
        uStack_648 = 0x65;
        doc_01 = (fdb_kvs_handle *)pfStack_6c8->op_stats;
        pcStack_6d8 = (code *)0x113955;
        iVar5 = bcmp(doc_01,afStack_550,*(size_t *)&pfStack_6c8->kvs_config);
        if (iVar5 != 0) goto LAB_00113ac8;
        doc_01 = (fdb_kvs_handle *)(pfVar6->field_6).seqtree;
        pcStack_6d8 = (code *)0x113970;
        iVar5 = bcmp(doc_01,unaff_R12,(size_t)(pfVar6->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00113a98;
      }
      uVar17 = (ulong)((int)uVar17 + 1);
      pcStack_6d8 = (code *)0x113984;
      fdb_doc_free((fdb_doc *)pfStack_6c8);
      pcStack_6d8 = (code *)0x11398e;
      fVar4 = fdb_iterator_next(pfStack_6c0);
      pfVar10 = pfVar6;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)uVar17 != *(int *)in_RCX + 1) {
      pcStack_6d8 = (code *)0x113a73;
      cb_inmem_snap();
    }
    pcStack_6d8 = (code *)0x1139ac;
    fVar4 = fdb_iterator_close(pfStack_6c0);
    pfVar11 = pfStack_6b0;
    pfVar6 = pfStack_6b8;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113b00;
    pfVar10 = (fdb_kvs_handle *)afStack_550;
    pcStack_6d8 = (code *)0x1139ce;
    sVar7 = strlen((char *)pfVar10);
    pcStack_6d8 = (code *)0x1139e7;
    fVar4 = fdb_get_kv(pfVar6,pfVar10,sVar7 + 1,&pfStack_698,&sStack_6a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113b05;
    pcStack_6d8 = (code *)0x113a09;
    iVar5 = bcmp(pfStack_698,auStack_656 + 6,sStack_6a0);
    pfVar6 = pfStack_698;
    if (iVar5 == 0) {
      pcStack_6d8 = (code *)0x113a19;
      fdb_free_block(pfStack_698);
LAB_00113a19:
      pcStack_6d8 = (code *)0x113a23;
      fdb_kvs_close(pfStack_6b8);
      return;
    }
  }
  pcStack_6d8 = snapshot_clone_test;
  cb_inmem_snap();
  pfStack_c50 = (fdb_iterator *)0x113b3a;
  fStack_8f8.bub_ctx.space_used = (uint64_t)pfVar6;
  fStack_8f8.bub_ctx.handle = unaff_R12;
  pfStack_6f0 = doc_01;
  pfStack_6e8 = pfVar10;
  pfStack_6e0 = pfVar11;
  pcStack_6d8 = (code *)uVar17;
  gettimeofday(&tStack_b20,(__timezone_ptr_t)0x0);
  pfStack_c50 = (fdb_iterator *)0x113b3f;
  memleak_start();
  pfStack_c50 = (fdb_iterator *)0x113b4e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar6 = (fdb_kvs_handle *)&fStack_8f8.config.encryption_key;
  pfStack_c50 = (fdb_iterator *)0x113b5e;
  fdb_get_default_config();
  config = (fdb_iterator *)auStack_b10;
  pfStack_c50 = (fdb_iterator *)0x113b6e;
  fdb_get_default_kvs_config();
  fStack_8f8.config.encryption_key.bytes[4] = '\0';
  fStack_8f8.config.encryption_key.bytes[5] = '\0';
  fStack_8f8.config.encryption_key.bytes[6] = '\0';
  fStack_8f8.config.encryption_key.bytes[7] = '\0';
  fStack_8f8.config.encryption_key.bytes[8] = '\0';
  fStack_8f8.config.encryption_key.bytes[9] = '\0';
  fStack_8f8.config.encryption_key.bytes[10] = '\0';
  fStack_8f8.config.encryption_key.bytes[0xb] = '\0';
  fStack_8f8.config.encryption_key.bytes[0xc] = '\0';
  fStack_8f8.config.encryption_key.bytes[0xd] = '\x04';
  fStack_8f8.config.encryption_key.bytes[0xe] = '\0';
  fStack_8f8.config.encryption_key.bytes[0xf] = '\0';
  fStack_8f8.config.encryption_key.bytes[0x10] = '\0';
  fStack_8f8.config.encryption_key.bytes[0x11] = '\0';
  fStack_8f8.config.encryption_key.bytes[0x12] = '\0';
  fStack_8f8.config.encryption_key.bytes[0x13] = '\0';
  fStack_8f8.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_8f8.config._180_4_ = 1;
  fStack_8f8.config.block_reusing_threshold._7_1_ = 0;
  pfStack_c50 = (fdb_iterator *)0x113b98;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar11 = (fdb_kvs_handle *)(auStack_c30 + 0x10);
  pfStack_c50 = (fdb_iterator *)0x113baf;
  fVar4 = fdb_open((fdb_file_handle **)pfVar11,"./mvcc_test1",(fdb_config *)pfVar6);
  doc_02 = (fdb_iterator *)(ulong)(uint)fVar4;
  pfStack_c50 = (fdb_iterator *)0x113bc1;
  fdb_kvs_open_default((fdb_file_handle *)auStack_c30._16_8_,&pfStack_c40,(fdb_kvs_config *)config);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_c50 = (fdb_iterator *)0x113bda;
    fVar4 = fdb_snapshot_open(pfStack_c40,(fdb_kvs_handle **)(auStack_c30 + 8),0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114595;
    pfStack_c50 = (fdb_iterator *)0x113bf4;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_c30._8_8_,&fStack_b50);
    if ((fdb_kvs_handle *)fStack_b50.last_seqnum != (fdb_kvs_handle *)0x0) {
      pfStack_c50 = (fdb_iterator *)0x113c07;
      snapshot_clone_test();
    }
    pfVar11 = (fdb_kvs_handle *)auStack_c30;
    pfStack_c50 = (fdb_iterator *)0x113c2a;
    fdb_iterator_init((fdb_kvs_handle *)auStack_c30._8_8_,(fdb_iterator **)pfVar11,(void *)0x0,0,
                      (void *)0x0,0,0);
    pfStack_c50 = (fdb_iterator *)0x113c32;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_c30._0_8_);
    pfVar10 = unaff_R12;
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011459a;
    pfStack_c50 = (fdb_iterator *)0x113c45;
    fdb_iterator_close((fdb_iterator *)auStack_c30._0_8_);
    pfStack_c50 = (fdb_iterator *)0x113c4f;
    fdb_kvs_close((fdb_kvs_handle *)auStack_c30._8_8_);
    lVar16 = 0;
    uVar17 = 0;
    do {
      pfStack_c50 = (fdb_iterator *)0x113c71;
      sprintf(auStack_b10 + 0x18,"key%d",uVar17 & 0xffffffff);
      pfStack_c50 = (fdb_iterator *)0x113c8d;
      sprintf((char *)&fStack_9f8,"meta%d",uVar17 & 0xffffffff);
      pfStack_c50 = (fdb_iterator *)0x113ca9;
      sprintf((char *)&fStack_8f8,"body%d",uVar17 & 0xffffffff);
      pfStack_c50 = (fdb_iterator *)0x113cb9;
      sVar7 = strlen(auStack_b10 + 0x18);
      pfStack_c50 = (fdb_iterator *)0x113cc4;
      sVar8 = strlen((char *)&fStack_9f8);
      pfStack_c50 = (fdb_iterator *)0x113ccf;
      sVar9 = strlen((char *)&fStack_8f8);
      pfStack_c50 = (fdb_iterator *)0x113cf4;
      fdb_doc_create((fdb_doc **)(auStack_bf8 + lVar16),auStack_b10 + 0x18,sVar7,&fStack_9f8,sVar8,
                     &fStack_8f8,sVar9);
      pfStack_c50 = (fdb_iterator *)0x113d03;
      fdb_set(pfStack_c40,*(fdb_doc **)(auStack_bf8 + uVar17 * 8));
      uVar17 = uVar17 + 1;
      lVar16 = lVar16 + 8;
    } while (uVar17 != 5);
    pfStack_c50 = (fdb_iterator *)0x113d23;
    fdb_commit((fdb_file_handle *)auStack_c30._16_8_,'\x01');
    uVar17 = 5;
    doc_04 = (fdb_doc **)(auStack_bf8 + 0x28);
    do {
      pfStack_c50 = (fdb_iterator *)0x113d4a;
      sprintf(auStack_b10 + 0x18,"key%d",uVar17 & 0xffffffff);
      pfStack_c50 = (fdb_iterator *)0x113d66;
      sprintf((char *)&fStack_9f8,"meta%d",uVar17 & 0xffffffff);
      pfStack_c50 = (fdb_iterator *)0x113d82;
      sprintf((char *)&fStack_8f8,"body%d",uVar17 & 0xffffffff);
      pfStack_c50 = (fdb_iterator *)0x113d8a;
      sVar7 = strlen(auStack_b10 + 0x18);
      pfStack_c50 = (fdb_iterator *)0x113d95;
      sVar8 = strlen((char *)&fStack_9f8);
      pfStack_c50 = (fdb_iterator *)0x113da0;
      sVar9 = strlen((char *)&fStack_8f8);
      pfStack_c50 = (fdb_iterator *)0x113dc0;
      fdb_doc_create(doc_04,auStack_b10 + 0x18,sVar7,&fStack_9f8,sVar8,&fStack_8f8,sVar9);
      pfStack_c50 = (fdb_iterator *)0x113dcd;
      fdb_set(pfStack_c40,*doc_04);
      uVar17 = uVar17 + 1;
      doc_04 = doc_04 + 1;
    } while (uVar17 != 9);
    pfVar6 = (fdb_kvs_handle *)(auStack_b10 + 0x18);
    pfStack_c50 = (fdb_iterator *)0x113dfc;
    sprintf((char *)pfVar6,"key%d",9);
    config = &fStack_9f8;
    pfStack_c50 = (fdb_iterator *)0x113e1a;
    sprintf((char *)config,"meta%d",9);
    pfVar10 = &fStack_8f8;
    pfStack_c50 = (fdb_iterator *)0x113e38;
    sprintf((char *)pfVar10,"Body%d",9);
    pfVar11 = (fdb_kvs_handle *)(auStack_bf8 + 0x48);
    pfStack_c50 = (fdb_iterator *)0x113e48;
    doc_01 = (fdb_kvs_handle *)strlen((char *)pfVar6);
    pfStack_c50 = (fdb_iterator *)0x113e53;
    doc_02 = (fdb_iterator *)strlen((char *)config);
    pfStack_c50 = (fdb_iterator *)0x113e5e;
    sVar7 = strlen((char *)pfVar10);
    pfStack_c50 = (fdb_iterator *)0x113e79;
    fdb_doc_create((fdb_doc **)pfVar11,pfVar6,(size_t)doc_01,config,(size_t)doc_02,pfVar10,sVar7);
    pfStack_c50 = (fdb_iterator *)0x113e86;
    fdb_set(pfStack_c40,(fdb_doc *)auStack_bf8._72_8_);
    pfStack_c50 = (fdb_iterator *)0x113e92;
    fdb_commit((fdb_file_handle *)auStack_c30._16_8_,'\0');
    **(undefined1 **)(auStack_bf8._72_8_ + 0x40) = 0x62;
    pfStack_c50 = (fdb_iterator *)0x113ea9;
    fdb_set(pfStack_c40,(fdb_doc *)auStack_bf8._72_8_);
    pfStack_c50 = (fdb_iterator *)0x113eb5;
    fdb_commit((fdb_file_handle *)auStack_c30._16_8_,'\0');
    pfStack_c10 = *(fdb_kvs_handle **)(auStack_bf8._72_8_ + 0x28);
    pfStack_c50 = (fdb_iterator *)0x113ed7;
    fVar4 = fdb_snapshot_open(pfStack_c40,&pfStack_c00,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011459f;
    pfStack_c50 = (fdb_iterator *)0x113ef1;
    fdb_set(pfStack_c40,(fdb_doc *)auStack_bf8._72_8_);
    pfStack_c50 = (fdb_iterator *)0x113efd;
    fdb_commit((fdb_file_handle *)auStack_c30._16_8_,'\0');
    uVar17 = 10;
    pfVar11 = (fdb_kvs_handle *)0x50;
    do {
      pfStack_c50 = (fdb_iterator *)0x113f24;
      sprintf(auStack_b10 + 0x18,"key%d",uVar17 & 0xffffffff);
      pfStack_c50 = (fdb_iterator *)0x113f40;
      sprintf((char *)&fStack_9f8,"meta%d",uVar17 & 0xffffffff);
      pfVar10 = &fStack_8f8;
      pfStack_c50 = (fdb_iterator *)0x113f5c;
      sprintf((char *)pfVar10,"body%d",uVar17 & 0xffffffff);
      doc_02 = (fdb_iterator *)(auStack_bf8 + (long)pfVar11);
      pfStack_c50 = (fdb_iterator *)0x113f6c;
      pfVar6 = (fdb_kvs_handle *)strlen(auStack_b10 + 0x18);
      pfStack_c50 = (fdb_iterator *)0x113f77;
      doc_01 = (fdb_kvs_handle *)strlen((char *)&fStack_9f8);
      pfStack_c50 = (fdb_iterator *)0x113f82;
      sVar7 = strlen((char *)pfVar10);
      pfStack_c50 = (fdb_iterator *)0x113fa7;
      fdb_doc_create((fdb_doc **)doc_02,auStack_b10 + 0x18,(size_t)pfVar6,&fStack_9f8,(size_t)doc_01
                     ,pfVar10,sVar7);
      pfStack_c50 = (fdb_iterator *)0x113fb6;
      fdb_set(pfStack_c40,*(fdb_doc **)(auStack_bf8 + uVar17 * 8));
      uVar17 = uVar17 + 1;
      pfVar11 = (fdb_kvs_handle *)((long)pfVar11 + 8);
    } while (uVar17 != 0xf);
    pfStack_c50 = (fdb_iterator *)0x113fd6;
    fdb_commit((fdb_file_handle *)auStack_c30._16_8_,'\x01');
    pfStack_c50 = (fdb_iterator *)0x113fee;
    fVar4 = fdb_set_log_callback(pfStack_c40,logCallbackFunc,"snapshot_clone_test");
    config = (fdb_iterator *)0xf;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145a4;
    pfStack_c50 = (fdb_iterator *)0x11400a;
    fVar4 = fdb_snapshot_open(pfStack_c40,(fdb_kvs_handle **)(auStack_c30 + 8),999999);
    pfVar6 = pfStack_c10;
    if (fVar4 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001145a9;
    pfStack_c50 = (fdb_iterator *)0x11402a;
    fVar4 = fdb_snapshot_open(pfStack_c40,(fdb_kvs_handle **)(auStack_c30 + 8),
                              (fdb_seqnum_t)pfStack_c10);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145ae;
    pfStack_c50 = (fdb_iterator *)0x114044;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_c30._8_8_,&pfStack_c18,(fdb_seqnum_t)pfVar6)
    ;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145b3;
    pfStack_c50 = (fdb_iterator *)0x114056;
    fVar4 = fdb_kvs_close((fdb_kvs_handle *)auStack_c30._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145b8;
    pfStack_c50 = (fdb_iterator *)0x114073;
    fdb_get_kvs_info(pfStack_c18,&fStack_b50);
    if ((fdb_kvs_handle *)fStack_b50.last_seqnum != pfVar6) {
      pfStack_c50 = (fdb_iterator *)0x114089;
      snapshot_clone_test();
    }
    uVar17 = 0xf;
    config = (fdb_iterator *)apfStack_b80;
    do {
      pfStack_c50 = (fdb_iterator *)0x1140b1;
      sprintf(auStack_b10 + 0x18,"key%d",uVar17 & 0xffffffff);
      doc_02 = &fStack_9f8;
      pfStack_c50 = (fdb_iterator *)0x1140cc;
      sprintf((char *)doc_02,"meta%d",uVar17 & 0xffffffff);
      pfVar6 = &fStack_8f8;
      pfStack_c50 = (fdb_iterator *)0x1140e7;
      sprintf((char *)pfVar6,"body%d",uVar17 & 0xffffffff);
      pfStack_c50 = (fdb_iterator *)0x1140ef;
      pfVar10 = (fdb_kvs_handle *)strlen(auStack_b10 + 0x18);
      pfStack_c50 = (fdb_iterator *)0x1140fa;
      doc_01 = (fdb_kvs_handle *)strlen((char *)doc_02);
      pfStack_c50 = (fdb_iterator *)0x114105;
      sVar7 = strlen((char *)pfVar6);
      pfStack_c50 = (fdb_iterator *)0x114125;
      fdb_doc_create((fdb_doc **)config,auStack_b10 + 0x18,(size_t)pfVar10,doc_02,(size_t)doc_01,
                     pfVar6,sVar7);
      pfStack_c50 = (fdb_iterator *)0x114132;
      fdb_set(pfStack_c40,*(fdb_doc **)config);
      uVar17 = uVar17 + 1;
      config = (fdb_iterator *)((long)config + 8);
    } while (uVar17 != 0x14);
    pfStack_c50 = (fdb_iterator *)0x11414f;
    fdb_commit((fdb_file_handle *)auStack_c30._16_8_,'\0');
    pfStack_c50 = (fdb_iterator *)0x114165;
    fVar4 = fdb_snapshot_open(pfStack_c00,&pfStack_c08,0xffffffffffffffff);
    pfVar11 = (fdb_kvs_handle *)0x14;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145bd;
    pfVar11 = (fdb_kvs_handle *)&pfStack_c38;
    pfStack_c50 = (fdb_iterator *)0x1141b0;
    fdb_doc_create((fdb_doc **)pfVar11,
                   (void *)(*(size_t **)
                             (auStack_bf8 + (((long)pfStack_c10 << 0x20) + 0x100000000 >> 0x1d)))[4]
                   ,**(size_t **)(auStack_bf8 + (((long)pfStack_c10 << 0x20) + 0x100000000 >> 0x1d))
                   ,(void *)0x0,0,(void *)0x0,0);
    pfStack_c50 = (fdb_iterator *)0x1141bd;
    fVar4 = fdb_get_metaonly(pfStack_c18,(fdb_doc *)pfStack_c38);
    if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001145c2;
    pfStack_c50 = (fdb_iterator *)0x1141d3;
    fdb_doc_free((fdb_doc *)pfStack_c38);
    pfStack_c50 = (fdb_iterator *)0x1141f7;
    fdb_doc_create((fdb_doc **)&pfStack_c38,*(kvs_ops_stat **)(auStack_bf8._40_8_ + 0x20),
                   *(size_t *)(fdb_kvs_config *)auStack_bf8._40_8_,(void *)0x0,0,(void *)0x0,0);
    pfStack_c50 = (fdb_iterator *)0x114204;
    fVar4 = fdb_get_metaonly(pfStack_c18,(fdb_doc *)pfStack_c38);
    unaff_R12 = (fdb_kvs_handle *)auStack_bf8._40_8_;
    doc_03 = pfStack_c38;
    pfVar11 = (fdb_kvs_handle *)&pfStack_c38;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145c7;
    pfVar6 = (fdb_kvs_handle *)pfStack_c38->op_stats;
    config = *(fdb_iterator **)(auStack_bf8._40_8_ + 0x20);
    pfStack_c50 = (fdb_iterator *)0x11422e;
    iVar5 = bcmp(pfVar6,config,*(size_t *)(fdb_kvs_config *)auStack_bf8._40_8_);
    if (iVar5 != 0) goto LAB_001145cc;
    pfVar6 = (fdb_kvs_handle *)doc_03->staletree;
    config = *(fdb_iterator **)((long)unaff_R12 + 0x38);
    pfStack_c50 = (fdb_iterator *)0x11424f;
    iVar5 = bcmp(pfVar6,config,(size_t)(unaff_R12->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_001145d7;
    pfStack_c50 = (fdb_iterator *)0x11425f;
    fdb_doc_free((fdb_doc *)doc_03);
    pfStack_c50 = (fdb_iterator *)0x114280;
    fdb_doc_create((fdb_doc **)&pfStack_c38,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    pfStack_c38->fhandle = (fdb_file_handle *)0x6;
    pfStack_c50 = (fdb_iterator *)0x114295;
    fVar4 = fdb_get_byseq(pfStack_c18,(fdb_doc *)pfStack_c38);
    pfVar11 = pfStack_c38;
    doc_03 = (fdb_kvs_handle *)&pfStack_c38;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145e2;
    pfVar6 = (fdb_kvs_handle *)pfStack_c38->op_stats;
    config = *(fdb_iterator **)(auStack_bf8._40_8_ + 0x20);
    pfStack_c50 = (fdb_iterator *)0x1142be;
    iVar5 = bcmp(pfVar6,config,*(size_t *)&pfStack_c38->kvs_config);
    unaff_R12 = (fdb_kvs_handle *)auStack_bf8._40_8_;
    if (iVar5 != 0) goto LAB_001145e7;
    pfVar6 = (fdb_kvs_handle *)(pfVar11->field_6).seqtree;
    config = (fdb_iterator *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_bf8._40_8_ + 0x40))->seqtree
    ;
    pfStack_c50 = (fdb_iterator *)0x1142de;
    iVar5 = bcmp(pfVar6,config,(size_t)(pfVar11->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_001145f2;
    pfStack_c50 = (fdb_iterator *)0x1142ee;
    fdb_doc_free((fdb_doc *)pfVar11);
    pfVar11 = (fdb_kvs_handle *)&pfStack_c38;
    pfStack_c38 = (fdb_kvs_handle *)0x0;
    doc_01 = (fdb_kvs_handle *)0x0;
    pfStack_c50 = (fdb_iterator *)0x11431d;
    fdb_iterator_init(pfStack_c18,(fdb_iterator **)auStack_c30,(void *)0x0,0,(void *)0x0,0,0);
    pfVar10 = pfVar6;
    do {
      pfStack_c50 = (fdb_iterator *)0x11432a;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_c30._0_8_,(fdb_doc **)pfVar11);
      pfVar6 = pfStack_c38;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011454f:
        pfStack_c50 = (fdb_iterator *)0x114554;
        snapshot_clone_test();
        pfVar6 = pfVar10;
LAB_00114554:
        pfStack_c50 = (fdb_iterator *)0x11455f;
        snapshot_clone_test();
LAB_0011455f:
        pfStack_c50 = (fdb_iterator *)0x11456a;
        snapshot_clone_test();
        goto LAB_0011456a;
      }
      config = (fdb_iterator *)pfStack_c38->op_stats;
      doc_02 = *(fdb_iterator **)(auStack_bf8 + (long)doc_01 * 8);
      unaff_R12 = (fdb_kvs_handle *)doc_02->_seqnum;
      pfStack_c50 = (fdb_iterator *)0x114352;
      iVar5 = bcmp(config,unaff_R12,*(size_t *)&pfStack_c38->kvs_config);
      pfVar10 = pfVar6;
      if (iVar5 != 0) {
        pfStack_c50 = (fdb_iterator *)0x11454f;
        snapshot_clone_test();
        goto LAB_0011454f;
      }
      config = (fdb_iterator *)pfVar6->staletree;
      unaff_R12 = (fdb_kvs_handle *)doc_02->tree_cursor_start;
      pfStack_c50 = (fdb_iterator *)0x114371;
      iVar5 = bcmp(config,unaff_R12,(size_t)(pfVar6->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0011455f;
      config = (fdb_iterator *)(pfVar6->field_6).seqtree;
      unaff_R12 = (fdb_kvs_handle *)doc_02->tree_cursor_prev;
      pfStack_c50 = (fdb_iterator *)0x114390;
      iVar5 = bcmp(config,unaff_R12,(size_t)(pfVar6->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_00114554;
      pfStack_c50 = (fdb_iterator *)0x1143a0;
      fdb_doc_free((fdb_doc *)pfVar6);
      pfStack_c38 = (fdb_kvs_handle *)0x0;
      doc_01 = (fdb_kvs_handle *)&(doc_01->kvs_config).field_0x1;
      pfStack_c50 = (fdb_iterator *)0x1143b6;
      pfVar15 = (fdb_iterator *)auStack_c30._0_8_;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_c30._0_8_);
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)doc_01 == 10) {
      pfStack_c50 = (fdb_iterator *)0x1143d5;
      fdb_iterator_close((fdb_iterator *)auStack_c30._0_8_);
      doc_01 = (fdb_kvs_handle *)0x0;
      pfStack_c50 = (fdb_iterator *)0x1143f6;
      fdb_iterator_init(pfStack_c08,(fdb_iterator **)auStack_c30,(void *)0x0,0,(void *)0x0,0,0);
      pfVar11 = (fdb_kvs_handle *)&pfStack_c38;
      do {
        pfStack_c50 = (fdb_iterator *)0x114408;
        fVar4 = fdb_iterator_get((fdb_iterator *)auStack_c30._0_8_,(fdb_doc **)pfVar11);
        pfVar6 = pfStack_c38;
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114575;
        config = (fdb_iterator *)pfStack_c38->op_stats;
        doc_02 = *(fdb_iterator **)(auStack_bf8 + (long)doc_01 * 8);
        unaff_R12 = (fdb_kvs_handle *)doc_02->_seqnum;
        pfStack_c50 = (fdb_iterator *)0x114430;
        iVar5 = bcmp(config,unaff_R12,*(size_t *)&pfStack_c38->kvs_config);
        if (iVar5 != 0) goto LAB_0011456a;
        config = (fdb_iterator *)pfVar6->staletree;
        unaff_R12 = (fdb_kvs_handle *)doc_02->tree_cursor_start;
        pfStack_c50 = (fdb_iterator *)0x11444f;
        iVar5 = bcmp(config,unaff_R12,(size_t)(pfVar6->kvs_config).custom_cmp);
        if (iVar5 != 0) goto LAB_00114585;
        config = (fdb_iterator *)(pfVar6->field_6).seqtree;
        unaff_R12 = (fdb_kvs_handle *)doc_02->tree_cursor_prev;
        pfStack_c50 = (fdb_iterator *)0x11446e;
        iVar5 = bcmp(config,unaff_R12,(size_t)(pfVar6->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_0011457a;
        pfStack_c50 = (fdb_iterator *)0x11447e;
        fdb_doc_free((fdb_doc *)pfVar6);
        pfStack_c38 = (fdb_kvs_handle *)0x0;
        doc_01 = (fdb_kvs_handle *)&(doc_01->kvs_config).field_0x1;
        pfStack_c50 = (fdb_iterator *)0x114494;
        pfVar15 = (fdb_iterator *)auStack_c30._0_8_;
        fVar4 = fdb_iterator_next((fdb_iterator *)auStack_c30._0_8_);
        pfVar10 = pfVar6;
      } while (fVar4 == FDB_RESULT_SUCCESS);
      if ((int)doc_01 == 10) {
        pfStack_c50 = (fdb_iterator *)0x1144b0;
        fdb_iterator_close((fdb_iterator *)auStack_c30._0_8_);
        pfStack_c50 = (fdb_iterator *)0x1144ba;
        fdb_kvs_close(pfStack_c40);
        pfStack_c50 = (fdb_iterator *)0x1144c4;
        fdb_kvs_close(pfStack_c00);
        pfStack_c50 = (fdb_iterator *)0x1144ce;
        fdb_kvs_close(pfStack_c08);
        pfStack_c50 = (fdb_iterator *)0x1144d8;
        fdb_kvs_close(pfStack_c18);
        pfStack_c50 = (fdb_iterator *)0x1144e2;
        fdb_close((fdb_file_handle *)auStack_c30._16_8_);
        lVar16 = 0;
        do {
          pfStack_c50 = (fdb_iterator *)0x1144ee;
          fdb_doc_free(*(fdb_doc **)(auStack_bf8 + lVar16 * 8));
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x14);
        pfStack_c50 = (fdb_iterator *)0x1144fc;
        fdb_shutdown();
        pfStack_c50 = (fdb_iterator *)0x114501;
        memleak_end();
        pcVar14 = "%s PASSED\n";
        if (snapshot_clone_test()::__test_pass != '\0') {
          pcVar14 = "%s FAILED\n";
        }
        pfStack_c50 = (fdb_iterator *)0x114532;
        fprintf(_stderr,pcVar14,"snapshot clone test");
        return;
      }
      goto LAB_00114602;
    }
  }
  else {
LAB_00114590:
    pfStack_c50 = (fdb_iterator *)0x114595;
    snapshot_clone_test();
LAB_00114595:
    pfStack_c50 = (fdb_iterator *)0x11459a;
    snapshot_clone_test();
    pfVar10 = unaff_R12;
LAB_0011459a:
    pfStack_c50 = (fdb_iterator *)0x11459f;
    snapshot_clone_test();
LAB_0011459f:
    pfStack_c50 = (fdb_iterator *)0x1145a4;
    snapshot_clone_test();
LAB_001145a4:
    pfStack_c50 = (fdb_iterator *)0x1145a9;
    snapshot_clone_test();
LAB_001145a9:
    pfStack_c50 = (fdb_iterator *)0x1145ae;
    snapshot_clone_test();
LAB_001145ae:
    pfStack_c50 = (fdb_iterator *)0x1145b3;
    snapshot_clone_test();
LAB_001145b3:
    pfStack_c50 = (fdb_iterator *)0x1145b8;
    snapshot_clone_test();
LAB_001145b8:
    pfStack_c50 = (fdb_iterator *)0x1145bd;
    snapshot_clone_test();
LAB_001145bd:
    pfStack_c50 = (fdb_iterator *)0x1145c2;
    snapshot_clone_test();
LAB_001145c2:
    pfStack_c50 = (fdb_iterator *)0x1145c7;
    snapshot_clone_test();
LAB_001145c7:
    unaff_R12 = pfVar10;
    doc_03 = pfVar11;
    pfStack_c50 = (fdb_iterator *)0x1145cc;
    snapshot_clone_test();
LAB_001145cc:
    pfStack_c50 = (fdb_iterator *)0x1145d7;
    snapshot_clone_test();
LAB_001145d7:
    pfStack_c50 = (fdb_iterator *)0x1145e2;
    snapshot_clone_test();
LAB_001145e2:
    pfVar11 = doc_03;
    pfStack_c50 = (fdb_iterator *)0x1145e7;
    snapshot_clone_test();
LAB_001145e7:
    pfStack_c50 = (fdb_iterator *)0x1145f2;
    snapshot_clone_test();
LAB_001145f2:
    pfStack_c50 = (fdb_iterator *)0x1145fd;
    pfVar15 = config;
    snapshot_clone_test();
  }
  pfStack_c50 = (fdb_iterator *)0x114602;
  snapshot_clone_test();
LAB_00114602:
  pfStack_c50 = (fdb_iterator *)snap_clone_thread;
  snapshot_clone_test();
  pfStack_ca8 = (fdb_doc *)0x0;
  pfVar10 = pfVar15->handle;
  iVar5 = *(int *)&pfVar15->seqtree_iterator;
  pfStack_c78 = pfVar11;
  pfStack_c70 = unaff_R12;
  pfStack_c68 = doc_01;
  pfStack_c60 = pfVar6;
  pfStack_c58 = config;
  pfStack_c50 = doc_02;
  gettimeofday(&tStack_c88,(__timezone_ptr_t)0x0);
  fVar4 = fdb_snapshot_open((fdb_kvs_handle *)pfVar15->hbtrie_iterator,&pfStack_c90,
                            0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7d5);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7d5,"void *snap_clone_thread(void *)");
  }
  lVar16 = 0;
  iStack_c94 = iVar5;
  fdb_iterator_init(pfStack_c90,&pfStack_ca0,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar4 = fdb_iterator_get(pfStack_ca0,&pfStack_ca8);
    doc_00 = pfStack_ca8;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7df);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7df,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfStack_ca8->key;
    lVar2 = *(long *)(&(pfVar10->kvs_config).create_if_missing + lVar16 * 8);
    pvVar3 = *(void **)(lVar2 + 0x20);
    iVar5 = bcmp(pvVar1,pvVar3,pfStack_ca8->keylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e0,"void *snap_clone_thread(void *)");
    }
    pvVar1 = doc_00->body;
    pvVar3 = *(void **)(lVar2 + 0x40);
    iVar5 = bcmp(pvVar1,pvVar3,doc_00->bodylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e1);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e1,"void *snap_clone_thread(void *)");
    }
    fdb_doc_free(doc_00);
    pfStack_ca8 = (fdb_doc *)0x0;
    lVar16 = lVar16 + 1;
    fVar4 = fdb_iterator_next(pfStack_ca0);
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if (iStack_c94 / 2 == (int)lVar16) {
    fdb_iterator_close(pfStack_ca0);
    fdb_kvs_close(pfStack_c90);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x7e9);
  __assert_fail("count==n/2",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x7e9,"void *snap_clone_thread(void *)");
}

Assistant:

void in_memory_snapshot_compaction_test()
{
    TEST_INIT();

    int n = 10, value_len=32;
    int i, r, c, idx;
    char cmd[256];
    char key[256], *value;
    char keystr[] = "k%05d";
    char valuestr[] = "value%08d";
    void *value_out;
    size_t valuelen;
    fdb_file_handle *db_file;
    fdb_kvs_handle *db, *db2, *snap;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_info info;
    fdb_iterator *fit;
    fdb_doc *doc;
    fdb_status s;
    struct cb_inmem_snap_args cargs;

    sprintf(cmd, SHELL_DEL " mvcc_test* > errorlog.txt");
    r = system(cmd);
    (void)r;

    memleak_start();

    value = (char*)malloc(value_len);

    config = fdb_get_default_config();
    config.durability_opt = FDB_DRB_ASYNC;
    config.seqtree_opt = FDB_SEQTREE_USE;
    config.wal_flush_before_commit = true;
    config.wal_threshold = n/5;
    config.multi_kv_instances = true;
    config.buffercache_size = 0;
    config.compaction_cb = cb_inmem_snap;
    config.compaction_cb_mask = FDB_CS_MOVE_DOC;
    config.compaction_cb_ctx = &cargs;

    kvs_config = fdb_get_default_kvs_config();

    s = fdb_open(&db_file, "./mvcc_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db, "db", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(db_file, &db2, "db", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    cargs.handle = db2;
    cargs.move_count = 0;
    cargs.n = n;
    cargs.keystr = keystr;
    cargs.valuestr = valuestr;
    cargs.value_len = value_len;

    // write
    for (i=0;i<n;++i){
        idx = i;
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        sprintf(value, valuestr, idx);
        s = fdb_set_kv(db, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    s = fdb_commit(db_file, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_compact(db_file, "./mvcc_test2");
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // open in-memory snapshot
    s = fdb_snapshot_open(db, &snap, FDB_SNAPSHOT_INMEM);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_get_kvs_info(snap, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(info.last_seqnum == (fdb_seqnum_t)n+1);

    s = fdb_iterator_init(snap, &fit, NULL, 0, NULL, 0, 0x0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    c = 0;
    do {
        doc = NULL;
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        if (c < n) {
            idx = c;
            sprintf(key, keystr, idx);
            memset(value, 'x', value_len);
            memcpy(value + value_len - 6, "<end>", 6);
            sprintf(value, valuestr, idx);
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CMP(doc->body, value, doc->bodylen);
        } else {
            // new document
            sprintf(key, "new_key");
            sprintf(value, "new_value");
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CMP(doc->body, value, doc->bodylen);
        }

        c++;
        fdb_doc_free(doc);
    } while (fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
    TEST_CHK(c == n + 1);

    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_get_kv(snap, (void*)key, strlen(key)+1, &value_out, &valuelen);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CMP(value_out, value, valuelen);
    fdb_free_block(value_out);

    fdb_kvs_close(snap);

    s = fdb_close(db_file);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    free(value);

    memleak_end();

    TEST_RESULT("in-memory snapshot with concurrent compaction test");
}